

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrWasm<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  WebAssemblyMemory *this_00;
  ArrayBufferBase *pAVar8;
  undefined4 extraout_var;
  ulong uVar10;
  ulong uVar11;
  long lVar9;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x233d,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar3) goto LAB_00a77911;
    *puVar7 = 0;
  }
  uVar6 = playout->Offset;
  uVar1 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  this_00 = GetWebAssemblyMemory(this);
  pAVar8 = WebAssemblyMemory::GetBuffer(this_00);
  uVar4 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(pAVar8);
  iVar5 = (*(pAVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])(pAVar8);
  lVar9 = CONCAT44(extraout_var,iVar5);
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x234b,"((0))","UNREACHED");
    if (bVar3) {
      *puVar7 = 0;
      return;
    }
LAB_00a77911:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  uVar11 = (ulong)uVar1 + (ulong)uVar6;
  switch(playout->ViewType) {
  case TYPE_INT8:
    if (uVar11 < uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar6 = (uint)*(char *)(lVar9 + uVar11);
LAB_00a77863:
      *(uint *)(*(long *)(this + 0x118) + uVar10 * 4) = uVar6;
      return;
    }
    break;
  case TYPE_UINT8:
    if (uVar11 < uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar6 = (uint)*(byte *)(lVar9 + uVar11);
      goto LAB_00a77863;
    }
    break;
  case TYPE_INT16:
    if (uVar11 + 2 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar6 = (uint)*(short *)(lVar9 + uVar11);
      goto LAB_00a77863;
    }
    break;
  case TYPE_UINT16:
    if (uVar11 + 2 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar6 = (uint)*(ushort *)(lVar9 + uVar11);
      goto LAB_00a77863;
    }
    break;
  default:
    if (uVar11 + 4 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar6 = *(uint *)(lVar9 + uVar11);
      goto LAB_00a77863;
    }
    break;
  case TYPE_FLOAT32:
    if (uVar11 + 4 <= (ulong)uVar4) {
      *(undefined4 *)(*(long *)(this + 0x130) + (ulong)playout->Value * 4) =
           *(undefined4 *)(lVar9 + uVar11);
      return;
    }
    break;
  case TYPE_FLOAT64:
    if (uVar11 + 8 <= (ulong)uVar4) {
      *(undefined8 *)(*(long *)(this + 0x128) + (ulong)playout->Value * 8) =
           *(undefined8 *)(lVar9 + uVar11);
      return;
    }
    break;
  case TYPE_INT64:
    if (uVar11 + 8 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar11 = *(ulong *)(lVar9 + uVar11);
LAB_00a778e7:
      *(ulong *)(*(long *)(this + 0x120) + uVar10 * 8) = uVar11;
      return;
    }
    break;
  case TYPE_INT8_TO_INT64:
    if (uVar11 < uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar11 = (ulong)*(char *)(lVar9 + uVar11);
      goto LAB_00a778e7;
    }
    break;
  case TYPE_UINT8_TO_INT64:
    if (uVar11 < uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar11 = (ulong)*(byte *)(lVar9 + uVar11);
      goto LAB_00a778e7;
    }
    break;
  case TYPE_INT16_TO_INT64:
    if (uVar11 + 2 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar11 = (ulong)*(short *)(lVar9 + uVar11);
      goto LAB_00a778e7;
    }
    break;
  case TYPE_UINT16_TO_INT64:
    if (uVar11 + 2 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar11 = (ulong)*(ushort *)(lVar9 + uVar11);
      goto LAB_00a778e7;
    }
    break;
  case TYPE_INT32_TO_INT64:
    if (uVar11 + 4 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar11 = (ulong)*(int *)(lVar9 + uVar11);
      goto LAB_00a778e7;
    }
    break;
  case TYPE_UINT32_TO_INT64:
    if (uVar11 + 4 <= (ulong)uVar4) {
      uVar10 = (ulong)playout->Value;
      uVar11 = (ulong)*(uint *)(lVar9 + uVar11);
      goto LAB_00a778e7;
    }
  }
  JavascriptError::ThrowWebAssemblyRuntimeError
            (*(ScriptContext **)(this + 0x78),-0x7ff5e497,(PCWSTR)0x0);
}

Assistant:

void InterpreterStackFrame::OP_LdArrWasm(const unaligned T* playout)
    {
#ifdef ENABLE_WASM
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = playout->Offset + (uint64)(uint32)GetRegRawInt(playout->SlotIndex);
        ArrayBufferBase* arr = GetWebAssemblyMemory()->GetBuffer();

        uint32 byteLength = arr->GetByteLength();
        BYTE* buffer = arr->GetBuffer();
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            WasmArrayBoundsCheck<MemType>(index, byteLength); \
            SetRegRaw<RegType>(playout->Value, (RegType)*(MemType*)(buffer + index)); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
#else
        Assert(UNREACHED);
#endif
    }